

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
::findImpl<axl::sl::PtrIterator<char_const,false>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
           *this,PtrIterator<const_char,_false> *accessor,size_t i0,size_t length)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  ulong in_RCX;
  long in_RDX;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  C c;
  intptr_t j;
  size_t i;
  size_t last;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  BoyerMooreSkipTablesBase<char> *patternPos;
  BoyerMooreSkipTablesBase<char> *this_00;
  
  sVar1 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  sVar3 = (long)&(((BoyerMooreSkipTablesBase<char> *)(sVar1 - 1))->m_badSkipTable).
                 super_BoyerMooreSkipTableRoot.m_table.
                 super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p + in_RDX;
  patternPos = (BoyerMooreSkipTablesBase<char> *)(sVar1 - 1);
  do {
    this_00 = patternPos;
    if (in_RCX <= sVar3) {
      return sVar3 - (long)patternPos;
    }
    while( true ) {
      pcVar2 = PtrIterator<const_char,_false>::operator[]
                         ((PtrIterator<const_char,_false> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffac = (int)*pcVar2;
      pcVar2 = Array<char,_axl::sl::ArrayDetails<char>_>::operator[]
                         ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (in_stack_ffffffffffffffac != *pcVar2) break;
      if (patternPos == (BoyerMooreSkipTablesBase<char> *)0x0) {
        return sVar3;
      }
      sVar3 = sVar3 - 1;
      patternPos = (BoyerMooreSkipTablesBase<char> *)
                   ((long)&patternPos[-1].m_goodSkipTable.super_BoyerMooreSkipTableRoot.m_table.
                           super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.
                           m_count + 7);
    }
    sVar1 = BoyerMooreSkipTablesBase<char>::getSkip
                      (this_00,(char)(sVar3 >> 0x38),(size_t)patternPos);
    sVar3 = sVar1 + sVar3;
    patternPos = this_00;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}